

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

bool dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::_removeBidirectionalEdge
               (LLVMNode *ths,LLVMNode *n,EdgesT *ths_cont,EdgesT *n_cont)

{
  size_t sVar1;
  size_t sVar2;
  pair<std::_Rb_tree_iterator<dg::LLVMNode_*>,_std::_Rb_tree_iterator<dg::LLVMNode_*>_> pVar3;
  LLVMNode *local_38;
  
  local_38 = ths;
  pVar3 = std::
          _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
          ::equal_range((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                         *)n_cont,&local_38);
  sVar1 = (n_cont->super_DGContainer<dg::LLVMNode_*,_4U>).container._M_t._M_impl.
          super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase_aux((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                  *)n_cont,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  sVar2 = (n_cont->super_DGContainer<dg::LLVMNode_*,_4U>).container._M_t._M_impl.
          super__Rb_tree_header._M_node_count;
  local_38 = n;
  pVar3 = std::
          _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
          ::equal_range((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                         *)ths_cont,&local_38);
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase_aux((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                  *)ths_cont,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  return sVar1 != sVar2;
}

Assistant:

static bool _removeBidirectionalEdge(NodeT *ths, NodeT *n, EdgesT &ths_cont,
                                         EdgesT &n_cont) {
        bool ret1 = n_cont.erase(ths);
#ifndef NDEBUG
        bool ret2 =
#endif
                ths_cont.erase(n);

        // must have both or none
        assert(ret1 == ret2 && "An edge without rev. or vice versa");

        return ret1;
    }